

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O1

int match_iface(char *rule,char *iface)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  
  if (*rule != '\0') {
    if (iface == (char *)0x0) {
      return 0;
    }
    lVar2 = 0;
    while (cVar1 = rule[lVar2], cVar1 != '+') {
      if (cVar1 != iface[lVar2]) {
        return 0;
      }
      if (cVar1 == '\0') {
        return 1;
      }
      bVar3 = lVar2 == 0xf;
      lVar2 = lVar2 + 1;
      if (bVar3) {
        return 1;
      }
    }
  }
  return 1;
}

Assistant:

int match_iface(const char *rule, const char *iface)
{
	if (rule[0] == '\0') {
		return 1;
	}

	if (iface == NULL) {
		return 0;
	}

	for (int i = 0; i < MAX_IFACE_LEN; i++) {

		if (rule[i] == '+') {
			break;
		}

		if (rule[i] != iface[i]) {
			return 0;
		}

		if (rule[i] == '\0') {
			break;
		}
	}

	return 1;
}